

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::renderDestinationIter(CopyImageTest *this)

{
  ostringstream *this_00;
  TestLog *log;
  State *rng;
  ObjectWrapper *pOVar1;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  ScopedLogSection destinationSection;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"Destination image verify.",&local_1d9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Destination image verify.",&local_1da);
  tcu::ScopedLogSection::ScopedLogSection(&destinationSection,log,(string *)local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)local_1b0);
  rng = this->m_state;
  pOVar1 = rng->dstImage;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Verifying destination image.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  anon_unknown_0::render
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             ((this->super_TestCase).m_context)->m_renderCtx,&this->m_state->textureRenderer,
             &rng->results,&rng->rng,pOVar1->m_object,&rng->dstImageLevels,&this->m_dstImageInfo,
             VERIFY_NONE);
  tcu::ScopedLogSection::~ScopedLogSection(&destinationSection);
  return;
}

Assistant:

void CopyImageTest::renderDestinationIter (void)
{
	TestLog&						log					= m_testCtx.getLog();
	const tcu::ScopedLogSection		destinationSection	(log, "Destination image verify.", "Destination image verify.");

	de::Random&						rng					= m_state->rng;
	tcu::ResultCollector&			results				= m_state->results;
	glu::ObjectWrapper&				dstImage			= *m_state->dstImage;
	vector<ArrayBuffer<deUint8> >&	dstImageLevels		= m_state->dstImageLevels;

	log << TestLog::Message << "Verifying destination image." << TestLog::EndMessage;

	render(m_testCtx, m_context.getRenderContext(), m_state->textureRenderer, results, rng, *dstImage, dstImageLevels, m_dstImageInfo, VERIFY_NONE);
}